

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_striped_sse41_128_16.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_stats_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  ushort *puVar1;
  undefined8 *puVar2;
  short *psVar3;
  uint uVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  void *pvVar7;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  int iVar16;
  parasail_result_t *ppVar17;
  __m128i *palVar18;
  __m128i *b;
  __m128i *palVar19;
  __m128i *b_00;
  __m128i *palVar20;
  __m128i *palVar21;
  __m128i *ptr;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *b_03;
  int16_t *ptr_00;
  uint uVar22;
  uint uVar23;
  __m128i *ptr_01;
  char *pcVar24;
  uint uVar25;
  undefined8 extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  long lVar26;
  __m128i *ptr_02;
  long lVar27;
  uint uVar28;
  int16_t iVar29;
  uint uVar30;
  char *__format;
  uint uVar31;
  ulong uVar32;
  __m128i *ptr_03;
  int iVar33;
  long lVar34;
  int32_t segNum;
  long lVar35;
  ulong uVar36;
  long lVar37;
  undefined4 uVar39;
  undefined4 uVar40;
  ulong uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  __m128i alVar47;
  undefined1 auVar48 [16];
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  ushort uVar64;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  __m128i alVar60;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  __m128i alVar69;
  ushort uVar70;
  ushort uVar73;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  undefined1 auVar71 [16];
  __m128i alVar72;
  short sVar80;
  undefined1 auVar81 [16];
  short sVar82;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar88;
  short sVar89;
  short sVar90;
  undefined1 auVar83 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  short sVar94;
  short sVar97;
  short sVar98;
  short sVar99;
  ulong uVar95;
  short sVar100;
  short sVar101;
  short sVar102;
  short sVar103;
  undefined1 auVar96 [16];
  undefined1 auVar104 [16];
  ulong uVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  ushort uVar108;
  ushort uVar109;
  ushort uVar110;
  undefined1 in_XMM11 [16];
  ushort uVar111;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  uint local_21c;
  int local_218;
  __m128i *local_210;
  __m128i *local_200;
  undefined1 local_1c8 [16];
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined8 local_118;
  undefined8 uStack_110;
  short local_108;
  short sStack_106;
  short local_f8;
  short sStack_f6;
  short local_a8;
  short sStack_a6;
  short local_88;
  short sStack_86;
  short sStack_84;
  short sStack_82;
  short sStack_80;
  short sStack_7e;
  short sStack_7c;
  short sStack_7a;
  __m128i_16_t e;
  __m128i_16_t h;
  size_t len;
  longlong extraout_RDX_00;
  short sVar38;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar24 = "profile";
  }
  else {
    pvVar5 = (profile->profile16).score;
    if (pvVar5 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar24 = "profile->profile16.score";
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar24 = "profile->matrix";
      }
      else {
        uVar4 = profile->s1Len;
        if ((int)uVar4 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar24 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar24 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar24 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar24 = "open";
        }
        else {
          if (-1 < gap) {
            uVar28 = uVar4 - 1;
            uVar36 = (ulong)uVar4 + 7 >> 3;
            uVar41 = (ulong)uVar28 % uVar36;
            pvVar7 = (profile->profile16).matches;
            pvVar8 = (profile->profile16).similar;
            uVar31 = -open;
            uVar25 = ppVar6->min;
            iVar33 = -uVar25;
            if (uVar25 != uVar31 && SBORROW4(uVar25,uVar31) == (int)(uVar25 + open) < 0) {
              iVar33 = open;
            }
            iVar15 = ppVar6->max;
            ppVar17 = parasail_result_new_stats();
            if (ppVar17 != (parasail_result_t *)0x0) {
              ppVar17->flag =
                   (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe
                   | (uint)(s2_end != 0) << 0xf | ppVar17->flag | 0x8210802;
              local_210 = parasail_memalign___m128i(0x10,uVar36);
              palVar18 = parasail_memalign___m128i(0x10,uVar36);
              b = parasail_memalign___m128i(0x10,uVar36);
              palVar19 = parasail_memalign___m128i(0x10,uVar36);
              b_00 = parasail_memalign___m128i(0x10,uVar36);
              palVar20 = parasail_memalign___m128i(0x10,uVar36);
              local_200 = parasail_memalign___m128i(0x10,uVar36);
              palVar21 = parasail_memalign___m128i(0x10,uVar36);
              ptr = parasail_memalign___m128i(0x10,uVar36);
              b_01 = parasail_memalign___m128i(0x10,uVar36);
              b_02 = parasail_memalign___m128i(0x10,uVar36);
              b_03 = parasail_memalign___m128i(0x10,uVar36);
              ptr_00 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
              c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              c[1]._0_1_ = b_02 == (__m128i *)0x0;
              auVar42._0_8_ = -(ulong)(local_210 == (__m128i *)0x0);
              auVar42._8_8_ = -(ulong)(palVar18 == (__m128i *)0x0);
              auVar65._0_8_ = -(ulong)(b == (__m128i *)0x0);
              auVar65._8_8_ = -(ulong)(palVar19 == (__m128i *)0x0);
              auVar42 = packssdw(auVar42,auVar65);
              auVar43._0_8_ = -(ulong)(b_00 == (__m128i *)0x0);
              auVar43._8_8_ = -(ulong)(palVar20 == (__m128i *)0x0);
              auVar104._0_8_ = -(ulong)(local_200 == (__m128i *)0x0);
              auVar104._8_8_ = -(ulong)(palVar21 == (__m128i *)0x0);
              auVar65 = packssdw(auVar43,auVar104);
              auVar42 = packssdw(auVar42,auVar65);
              if (((((b_01 != (__m128i *)0x0 && ptr != (__m128i *)0x0) && b_02 != (__m128i *)0x0) &&
                   b_03 != (__m128i *)0x0) && ptr_00 != (int16_t *)0x0) &&
                  ((((((((((((((((auVar42 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                                (auVar42 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar42 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar42 >> 0x1f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar42 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar42 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar42 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar42 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar42 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar42 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar42 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar42 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar42 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar42 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar42 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar42[0xf])) {
                iVar16 = s2Len + -1;
                uVar22 = 7 - (int)(uVar28 / uVar36);
                len = (size_t)uVar22;
                auVar42 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar39 = auVar42._0_4_;
                auVar42 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
                uVar40 = auVar42._0_4_;
                local_21c = iVar33 - 0x7fff;
                auVar42 = pshuflw(ZEXT416(local_21c),ZEXT416(local_21c),0);
                local_f8 = auVar42._0_2_;
                sStack_f6 = auVar42._2_2_;
                auVar65 = ZEXT416(CONCAT22((short)(uVar25 >> 0x10),0x7ffe - (short)iVar15));
                auVar65 = pshuflw(auVar65,auVar65,0);
                local_a8 = auVar65._0_2_;
                sStack_a6 = auVar65._2_2_;
                auVar43 = pshuflw(ZEXT416(uVar22),ZEXT416(uVar22),0);
                local_108 = auVar43._0_2_;
                sStack_106 = auVar43._2_2_;
                c[0] = uVar36;
                parasail_memset___m128i(b,c,len);
                c_00[1] = extraout_RDX_00;
                c_00[0] = uVar36;
                parasail_memset___m128i(b_00,c_00,len);
                c_01[1] = extraout_RDX_01;
                c_01[0] = uVar36;
                parasail_memset___m128i(local_200,c_01,len);
                c_02[1] = extraout_RDX_02;
                c_02[0] = uVar36;
                parasail_memset___m128i(b_01,c_02,len);
                c_03[1] = extraout_RDX_03;
                c_03[0] = uVar36;
                parasail_memset___m128i(b_02,c_03,len);
                c_04[1] = extraout_RDX_04;
                c_04[0] = uVar36;
                parasail_memset___m128i(b_03,c_04,len);
                lVar37 = (long)(int)uVar31;
                for (uVar32 = 0; uVar32 != uVar36; uVar32 = uVar32 + 1) {
                  lVar26 = lVar37;
                  for (lVar35 = 0; lVar35 != 8; lVar35 = lVar35 + 1) {
                    lVar34 = lVar26;
                    if (s1_beg != 0) {
                      lVar34 = 0;
                    }
                    lVar27 = -0x8000;
                    if (-0x8000 < lVar34) {
                      lVar27 = lVar34;
                    }
                    lVar34 = lVar34 - (ulong)(uint)open;
                    if (lVar34 < -0x7fff) {
                      lVar34 = -0x8000;
                    }
                    *(short *)((long)&h + lVar35 * 2) = (short)lVar27;
                    *(short *)((long)&e + lVar35 * 2) = (short)lVar34;
                    lVar26 = lVar26 - uVar36 * (uint)gap;
                  }
                  local_210[uVar32][0] = h.m[0];
                  local_210[uVar32][1] = h.m[1];
                  ptr[uVar32][0] = e.m[0];
                  ptr[uVar32][1] = e.m[1];
                  lVar37 = lVar37 - (ulong)(uint)gap;
                }
                *ptr_00 = 0;
                uVar25 = uVar31;
                for (uVar32 = 1; s2Len + 1 != uVar32; uVar32 = uVar32 + 1) {
                  iVar29 = -0x8000;
                  if (-0x8000 < (int)uVar25) {
                    iVar29 = (int16_t)uVar25;
                  }
                  if (s2_beg != 0) {
                    iVar29 = 0;
                  }
                  ptr_00[uVar32] = iVar29;
                  uVar25 = uVar25 - gap;
                }
                uVar25 = (uint)uVar36;
                uVar23 = uVar25 - 1;
                local_1a8 = CONCAT26(sStack_a6,CONCAT24(local_a8,auVar65._0_4_));
                uStack_1a0 = CONCAT26(sStack_a6,CONCAT24(local_a8,auVar65._0_4_));
                local_178._4_2_ = local_f8;
                local_178._0_4_ = auVar42._0_4_;
                local_178._6_2_ = sStack_f6;
                local_178._8_2_ = local_f8;
                local_178._10_2_ = sStack_f6;
                local_178._12_2_ = local_f8;
                local_178._14_2_ = sStack_f6;
                uVar32 = 0;
                auVar92 = local_178;
                auVar93 = local_178;
                auVar83 = local_178;
                auVar114 = local_178;
                local_218 = iVar16;
                do {
                  ptr_03 = palVar21;
                  palVar21 = palVar20;
                  ptr_02 = palVar19;
                  ptr_01 = palVar18;
                  if (uVar32 == (uint)s2Len) {
                    iVar33 = 0;
                    sVar80 = 0;
                    if (s2_end == 0) {
                      sVar38 = 0;
                      sVar49 = 0;
                    }
                    else {
                      while( true ) {
                        uVar95 = auVar83._0_8_;
                        lVar35 = auVar83._8_8_;
                        uVar32 = auVar93._0_8_;
                        lVar26 = auVar93._8_8_;
                        uVar105 = auVar114._0_8_;
                        lVar34 = auVar114._8_8_;
                        uVar36 = auVar92._0_8_;
                        lVar37 = auVar92._8_8_;
                        if ((int)uVar22 <= iVar33) break;
                        auVar83._0_8_ = uVar95 << 0x10;
                        auVar83._8_8_ = lVar35 << 0x10 | uVar95 >> 0x30;
                        auVar93._0_8_ = uVar32 << 0x10;
                        auVar93._8_8_ = lVar26 << 0x10 | uVar32 >> 0x30;
                        auVar114._0_8_ = uVar105 << 0x10;
                        auVar114._8_8_ = lVar34 << 0x10 | uVar105 >> 0x30;
                        auVar92._0_8_ = uVar36 << 0x10;
                        auVar92._8_8_ = lVar37 << 0x10 | uVar36 >> 0x30;
                        iVar33 = iVar33 + 1;
                      }
                      local_21c = (uint)auVar83._14_2_;
                      sVar80 = auVar93._14_2_;
                      sVar38 = auVar114._14_2_;
                      sVar49 = auVar92._14_2_;
                    }
                    uVar31 = uVar28;
                    if (s1_end != 0) {
                      uVar36 = 0;
                      while( true ) {
                        if ((uVar25 & 0xfffffff) << 3 == (uint)uVar36) break;
                        uVar30 = ((uint)uVar36 & 7) * uVar25 + ((uint)(uVar36 >> 3) & 0x1fffffff);
                        uVar23 = local_21c;
                        if ((int)uVar30 < (int)uVar4) {
                          uVar70 = *(ushort *)((long)*local_210 + uVar36 * 2);
                          uVar23 = (uint)uVar70;
                          if (((short)(ushort)local_21c < (short)uVar70) ||
                             (((uVar23 = local_21c, uVar70 == (ushort)local_21c &&
                               (local_218 == iVar16)) && ((int)uVar30 < (int)uVar31)))) {
                            sVar80 = *(short *)((long)*b + uVar36 * 2);
                            sVar38 = *(short *)((long)*b_00 + uVar36 * 2);
                            sVar49 = *(short *)((long)*local_200 + uVar36 * 2);
                            uVar31 = uVar30;
                            local_218 = iVar16;
                          }
                        }
                        local_21c = uVar23;
                        uVar36 = uVar36 + 1;
                      }
                    }
                    if (s2_end == 0 && s1_end == 0) {
                      alVar72 = local_210[uVar41];
                      alVar69 = b[uVar41];
                      alVar60 = b_00[uVar41];
                      alVar47 = local_200[uVar41];
                      iVar33 = 0;
                      while( true ) {
                        uVar95 = alVar72[0];
                        lVar34 = alVar72[1];
                        uVar32 = alVar69[0];
                        lVar35 = alVar69[1];
                        uVar36 = alVar60[0];
                        lVar26 = alVar60[1];
                        uVar41 = alVar47[0];
                        lVar37 = alVar47[1];
                        if ((int)uVar22 <= iVar33) break;
                        alVar72[0] = uVar95 << 0x10;
                        alVar72[1] = lVar34 << 0x10 | uVar95 >> 0x30;
                        alVar69[0] = uVar32 << 0x10;
                        alVar69[1] = lVar35 << 0x10 | uVar32 >> 0x30;
                        alVar60[0] = uVar36 << 0x10;
                        alVar60[1] = lVar26 << 0x10 | uVar36 >> 0x30;
                        alVar47[0] = uVar41 << 0x10;
                        alVar47[1] = lVar37 << 0x10 | uVar41 >> 0x30;
                        iVar33 = iVar33 + 1;
                      }
                      local_21c._0_2_ = alVar72[1]._6_2_;
                      sVar80 = alVar69[1]._6_2_;
                      sVar38 = alVar60[1]._6_2_;
                      sVar49 = alVar47[1]._6_2_;
                      uVar31 = uVar28;
                      local_218 = iVar16;
                    }
                    auVar48._0_2_ = -(ushort)((short)local_1a8 < local_f8);
                    auVar48._2_2_ = -(ushort)(local_1a8._2_2_ < sStack_f6);
                    auVar48._4_2_ = -(ushort)(local_1a8._4_2_ < local_f8);
                    auVar48._6_2_ = -(ushort)(local_1a8._6_2_ < sStack_f6);
                    auVar48._8_2_ = -(ushort)((short)uStack_1a0 < local_f8);
                    auVar48._10_2_ = -(ushort)(uStack_1a0._2_2_ < sStack_f6);
                    auVar48._12_2_ = -(ushort)(uStack_1a0._4_2_ < local_f8);
                    auVar48._14_2_ = -(ushort)(uStack_1a0._6_2_ < sStack_f6);
                    auVar81._0_2_ = -(ushort)(local_a8 < local_178._0_2_);
                    auVar81._2_2_ = -(ushort)(sStack_a6 < local_178._2_2_);
                    auVar81._4_2_ = -(ushort)(local_a8 < local_178._4_2_);
                    auVar81._6_2_ = -(ushort)(sStack_a6 < local_178._6_2_);
                    auVar81._8_2_ = -(ushort)(local_a8 < local_178._8_2_);
                    auVar81._10_2_ = -(ushort)(sStack_a6 < local_178._10_2_);
                    auVar81._12_2_ = -(ushort)(local_a8 < local_178._12_2_);
                    auVar81._14_2_ = -(ushort)(sStack_a6 < local_178._14_2_);
                    auVar81 = auVar81 | auVar48;
                    if ((((((((((((((((auVar81 >> 7 & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar81 >> 0xf & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar81 >> 0x17 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                   (auVar81 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar81 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar81 >> 0x2f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar81 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar81 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar81 >> 0x47 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar81 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar81 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar81 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar81 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar81 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar81 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar81[0xf] < '\0') {
                      *(byte *)&ppVar17->flag = (byte)ppVar17->flag | 0x40;
                      local_21c._0_2_ = 0;
                      sVar80 = 0;
                      sVar38 = 0;
                      sVar49 = 0;
                      local_218 = 0;
                      uVar31 = 0;
                    }
                    ppVar17->score = (int)(short)(ushort)local_21c;
                    ppVar17->end_query = uVar31;
                    ppVar17->end_ref = local_218;
                    *(int *)(ppVar17->field_4).extra = (int)sVar80;
                    ((ppVar17->field_4).stats)->similar = (int)sVar38;
                    ((ppVar17->field_4).stats)->length = (int)sVar49;
                    parasail_free(ptr_00);
                    parasail_free(b_03);
                    parasail_free(b_02);
                    parasail_free(b_01);
                    parasail_free(ptr);
                    parasail_free(ptr_03);
                    parasail_free(local_200);
                    parasail_free(palVar21);
                    parasail_free(b_00);
                    parasail_free(ptr_02);
                    parasail_free(b);
                    parasail_free(ptr_01);
                    parasail_free(local_210);
                    return ppVar17;
                  }
                  uVar95 = local_210[uVar23][0];
                  uVar105 = b[uVar23][0];
                  uVar9 = b_00[uVar23][0];
                  uVar10 = local_200[uVar23][0];
                  auVar112._0_8_ = uVar105 << 0x10;
                  auVar112._8_8_ = b[uVar23][1] << 0x10 | uVar105 >> 0x30;
                  auVar91._0_8_ = uVar9 << 0x10;
                  auVar91._8_8_ = b_00[uVar23][1] << 0x10 | uVar9 >> 0x30;
                  auVar113._0_8_ = uVar10 << 0x10;
                  auVar113._8_8_ = local_200[uVar23][1] << 0x10 | uVar10 >> 0x30;
                  auVar56._8_8_ = local_210[uVar23][1] << 0x10 | uVar95 >> 0x30;
                  auVar56._0_8_ = uVar95 << 0x10 | (ulong)(ushort)ptr_00[uVar32];
                  lVar26 = (long)(int)(ppVar6->mapper[(byte)s2[uVar32]] * uVar25) * 0x10;
                  local_1c8 = (undefined1  [16])0x0;
                  lVar37 = 0;
                  auVar96._4_2_ = local_f8;
                  auVar96._0_4_ = auVar42._0_4_;
                  auVar96._6_2_ = sStack_f6;
                  auVar96._8_2_ = local_f8;
                  auVar96._10_2_ = sStack_f6;
                  auVar96._12_2_ = local_f8;
                  auVar96._14_2_ = sStack_f6;
                  local_168 = (undefined1  [16])0x0;
                  in_XMM11 = pmovsxbw(in_XMM11,0x101010101010101);
                  for (; uVar36 << 4 != lVar37; lVar37 = lVar37 + 0x10) {
                    auVar65 = *(undefined1 (*) [16])((long)*ptr + lVar37);
                    auVar43 = *(undefined1 (*) [16])((long)*b_01 + lVar37);
                    auVar104 = *(undefined1 (*) [16])((long)*b_02 + lVar37);
                    auVar67 = *(undefined1 (*) [16])((long)*b_03 + lVar37);
                    auVar56 = paddsw(auVar56,*(undefined1 (*) [16])((long)pvVar5 + lVar37 + lVar26))
                    ;
                    sVar80 = auVar65._0_2_;
                    uVar61 = auVar56._0_2_;
                    uVar70 = (ushort)((short)uVar61 < sVar80) * sVar80 |
                             ((short)uVar61 >= sVar80) * uVar61;
                    sVar80 = auVar65._2_2_;
                    uVar62 = auVar56._2_2_;
                    uVar73 = (ushort)((short)uVar62 < sVar80) * sVar80 |
                             ((short)uVar62 >= sVar80) * uVar62;
                    sVar80 = auVar65._4_2_;
                    uVar63 = auVar56._4_2_;
                    uVar74 = (ushort)((short)uVar63 < sVar80) * sVar80 |
                             ((short)uVar63 >= sVar80) * uVar63;
                    sVar80 = auVar65._6_2_;
                    uVar64 = auVar56._6_2_;
                    uVar75 = (ushort)((short)uVar64 < sVar80) * sVar80 |
                             ((short)uVar64 >= sVar80) * uVar64;
                    sVar80 = auVar65._8_2_;
                    uVar108 = auVar56._8_2_;
                    uVar76 = (ushort)((short)uVar108 < sVar80) * sVar80 |
                             ((short)uVar108 >= sVar80) * uVar108;
                    sVar80 = auVar65._10_2_;
                    uVar109 = auVar56._10_2_;
                    uVar77 = (ushort)((short)uVar109 < sVar80) * sVar80 |
                             ((short)uVar109 >= sVar80) * uVar109;
                    sVar80 = auVar65._12_2_;
                    uVar110 = auVar56._12_2_;
                    uVar111 = auVar56._14_2_;
                    uVar78 = (ushort)((short)uVar110 < sVar80) * sVar80 |
                             ((short)uVar110 >= sVar80) * uVar110;
                    sVar80 = auVar65._14_2_;
                    uVar79 = (ushort)((short)uVar111 < sVar80) * sVar80 |
                             ((short)uVar111 >= sVar80) * uVar111;
                    sVar80 = auVar96._0_2_;
                    auVar66._0_2_ =
                         (ushort)((short)uVar70 < sVar80) * sVar80 |
                         ((short)uVar70 >= sVar80) * uVar70;
                    sVar38 = auVar96._2_2_;
                    auVar66._2_2_ =
                         (ushort)((short)uVar73 < sVar38) * sVar38 |
                         ((short)uVar73 >= sVar38) * uVar73;
                    sVar49 = auVar96._4_2_;
                    auVar66._4_2_ =
                         (ushort)((short)uVar74 < sVar49) * sVar49 |
                         ((short)uVar74 >= sVar49) * uVar74;
                    sVar50 = auVar96._6_2_;
                    auVar66._6_2_ =
                         (ushort)((short)uVar75 < sVar50) * sVar50 |
                         ((short)uVar75 >= sVar50) * uVar75;
                    sVar51 = auVar96._8_2_;
                    auVar66._8_2_ =
                         (ushort)((short)uVar76 < sVar51) * sVar51 |
                         ((short)uVar76 >= sVar51) * uVar76;
                    sVar52 = auVar96._10_2_;
                    auVar66._10_2_ =
                         (ushort)((short)uVar77 < sVar52) * sVar52 |
                         ((short)uVar77 >= sVar52) * uVar77;
                    sVar53 = auVar96._12_2_;
                    auVar66._12_2_ =
                         (ushort)((short)uVar78 < sVar53) * sVar53 |
                         ((short)uVar78 >= sVar53) * uVar78;
                    sVar54 = auVar96._14_2_;
                    auVar66._14_2_ =
                         (ushort)((short)uVar79 < sVar54) * sVar54 |
                         ((short)uVar79 >= sVar54) * uVar79;
                    *(undefined1 (*) [16])((long)*ptr_01 + lVar37) = auVar66;
                    auVar71._0_2_ = -(ushort)(sVar80 < (short)uVar70);
                    auVar71._2_2_ = -(ushort)(sVar38 < (short)uVar73);
                    auVar71._4_2_ = -(ushort)(sVar49 < (short)uVar74);
                    auVar71._6_2_ = -(ushort)(sVar50 < (short)uVar75);
                    auVar71._8_2_ = -(ushort)(sVar51 < (short)uVar76);
                    auVar71._10_2_ = -(ushort)(sVar52 < (short)uVar77);
                    auVar71._12_2_ = -(ushort)(sVar53 < (short)uVar78);
                    auVar71._14_2_ = -(ushort)(sVar54 < (short)uVar79);
                    auVar106 = pblendvb(local_1c8,auVar43,auVar71);
                    auVar56 = paddsw(auVar112,*(undefined1 (*) [16])((long)pvVar7 + lVar37 + lVar26)
                                    );
                    auVar57._0_2_ = -(ushort)(uVar61 == auVar66._0_2_);
                    auVar57._2_2_ = -(ushort)(uVar62 == auVar66._2_2_);
                    auVar57._4_2_ = -(ushort)(uVar63 == auVar66._4_2_);
                    auVar57._6_2_ = -(ushort)(uVar64 == auVar66._6_2_);
                    auVar57._8_2_ = -(ushort)(uVar108 == auVar66._8_2_);
                    auVar57._10_2_ = -(ushort)(uVar109 == auVar66._10_2_);
                    auVar57._12_2_ = -(ushort)(uVar110 == auVar66._12_2_);
                    auVar57._14_2_ = -(ushort)(uVar111 == auVar66._14_2_);
                    auVar107 = pblendvb(auVar106,auVar56,auVar57);
                    *(undefined1 (*) [16])((long)*ptr_02 + lVar37) = auVar107;
                    auVar56 = pblendvb(local_168,auVar104,auVar71);
                    auVar112 = paddsw(auVar91,*(undefined1 (*) [16])((long)pvVar8 + lVar37 + lVar26)
                                     );
                    auVar91 = pblendvb(auVar56,auVar112,auVar57);
                    *(undefined1 (*) [16])((long)*palVar21 + lVar37) = auVar91;
                    auVar106 = pblendvb(in_XMM11,auVar67,auVar71);
                    auVar56 = pmovsxbw(auVar71,0x101010101010101);
                    auVar112 = paddsw(auVar113,auVar56);
                    auVar113 = pblendvb(auVar106,auVar112,auVar57);
                    *(undefined1 (*) [16])((long)*ptr_03 + lVar37) = auVar113;
                    local_1a8._0_4_ =
                         CONCAT22(((short)auVar66._2_2_ < local_1a8._2_2_) * auVar66._2_2_ |
                                  (ushort)((short)auVar66._2_2_ >= local_1a8._2_2_) *
                                  local_1a8._2_2_,
                                  ((short)auVar66._0_2_ < (short)local_1a8) * auVar66._0_2_ |
                                  (ushort)((short)auVar66._0_2_ >= (short)local_1a8) *
                                  (short)local_1a8);
                    local_1a8._0_6_ =
                         CONCAT24(((short)auVar66._4_2_ < local_1a8._4_2_) * auVar66._4_2_ |
                                  (ushort)((short)auVar66._4_2_ >= local_1a8._4_2_) *
                                  local_1a8._4_2_,(undefined4)local_1a8);
                    local_1a8 = CONCAT26(((short)auVar66._6_2_ < local_1a8._6_2_) * auVar66._6_2_ |
                                         (ushort)((short)auVar66._6_2_ >= local_1a8._6_2_) *
                                         local_1a8._6_2_,(undefined6)local_1a8);
                    uStack_1a0._0_4_ =
                         CONCAT22(((short)auVar66._10_2_ < uStack_1a0._2_2_) * auVar66._10_2_ |
                                  (ushort)((short)auVar66._10_2_ >= uStack_1a0._2_2_) *
                                  uStack_1a0._2_2_,
                                  ((short)auVar66._8_2_ < (short)uStack_1a0) * auVar66._8_2_ |
                                  (ushort)((short)auVar66._8_2_ >= (short)uStack_1a0) *
                                  (short)uStack_1a0);
                    uStack_1a0._0_6_ =
                         CONCAT24(((short)auVar66._12_2_ < uStack_1a0._4_2_) * auVar66._12_2_ |
                                  (ushort)((short)auVar66._12_2_ >= uStack_1a0._4_2_) *
                                  uStack_1a0._4_2_,(undefined4)uStack_1a0);
                    uStack_1a0 = CONCAT26(((short)auVar66._14_2_ < uStack_1a0._6_2_) *
                                          auVar66._14_2_ |
                                          (ushort)((short)auVar66._14_2_ >= uStack_1a0._6_2_) *
                                          uStack_1a0._6_2_,(undefined6)uStack_1a0);
                    uVar76 = ((short)local_178._0_2_ < (short)auVar66._0_2_) * auVar66._0_2_ |
                             (ushort)((short)local_178._0_2_ >= (short)auVar66._0_2_) *
                             local_178._0_2_;
                    uVar108 = ((short)local_178._2_2_ < (short)auVar66._2_2_) * auVar66._2_2_ |
                              (ushort)((short)local_178._2_2_ >= (short)auVar66._2_2_) *
                              local_178._2_2_;
                    uVar77 = ((short)local_178._4_2_ < (short)auVar66._4_2_) * auVar66._4_2_ |
                             (ushort)((short)local_178._4_2_ >= (short)auVar66._4_2_) *
                             local_178._4_2_;
                    uVar109 = ((short)local_178._6_2_ < (short)auVar66._6_2_) * auVar66._6_2_ |
                              (ushort)((short)local_178._6_2_ >= (short)auVar66._6_2_) *
                              local_178._6_2_;
                    uVar78 = ((short)local_178._8_2_ < (short)auVar66._8_2_) * auVar66._8_2_ |
                             (ushort)((short)local_178._8_2_ >= (short)auVar66._8_2_) *
                             local_178._8_2_;
                    uVar110 = ((short)local_178._10_2_ < (short)auVar66._10_2_) * auVar66._10_2_ |
                              (ushort)((short)local_178._10_2_ >= (short)auVar66._10_2_) *
                              local_178._10_2_;
                    uVar79 = ((short)local_178._12_2_ < (short)auVar66._12_2_) * auVar66._12_2_ |
                             (ushort)((short)local_178._12_2_ >= (short)auVar66._12_2_) *
                             local_178._12_2_;
                    uVar111 = ((short)local_178._14_2_ < (short)auVar66._14_2_) * auVar66._14_2_ |
                              (ushort)((short)local_178._14_2_ >= (short)auVar66._14_2_) *
                              local_178._14_2_;
                    sVar80 = auVar113._0_2_;
                    sVar38 = auVar91._0_2_;
                    uVar70 = (ushort)(sVar38 < sVar80) * sVar80 |
                             (ushort)(sVar38 >= sVar80) * sVar38;
                    sVar80 = auVar113._2_2_;
                    sVar38 = auVar91._2_2_;
                    uVar61 = (ushort)(sVar38 < sVar80) * sVar80 |
                             (ushort)(sVar38 >= sVar80) * sVar38;
                    sVar80 = auVar113._4_2_;
                    sVar38 = auVar91._4_2_;
                    uVar73 = (ushort)(sVar38 < sVar80) * sVar80 |
                             (ushort)(sVar38 >= sVar80) * sVar38;
                    sVar80 = auVar113._6_2_;
                    sVar38 = auVar91._6_2_;
                    uVar62 = (ushort)(sVar38 < sVar80) * sVar80 |
                             (ushort)(sVar38 >= sVar80) * sVar38;
                    sVar80 = auVar113._8_2_;
                    sVar38 = auVar91._8_2_;
                    uVar63 = (ushort)(sVar38 < sVar80) * sVar80 |
                             (ushort)(sVar38 >= sVar80) * sVar38;
                    sVar80 = auVar113._10_2_;
                    sVar38 = auVar91._10_2_;
                    uVar74 = (ushort)(sVar38 < sVar80) * sVar80 |
                             (ushort)(sVar38 >= sVar80) * sVar38;
                    sVar80 = auVar113._12_2_;
                    sVar38 = auVar91._12_2_;
                    sVar49 = auVar91._14_2_;
                    uVar75 = (ushort)(sVar38 < sVar80) * sVar80 |
                             (ushort)(sVar38 >= sVar80) * sVar38;
                    sVar80 = auVar113._14_2_;
                    uVar64 = (ushort)(sVar49 < sVar80) * sVar80 |
                             (ushort)(sVar49 >= sVar80) * sVar49;
                    auVar106._4_4_ = uVar39;
                    auVar106._0_4_ = uVar39;
                    auVar106._8_4_ = uVar39;
                    auVar106._12_4_ = uVar39;
                    auVar112 = psubsw(auVar66,auVar106);
                    auVar13._4_4_ = uVar40;
                    auVar13._0_4_ = uVar40;
                    auVar13._8_4_ = uVar40;
                    auVar13._12_4_ = uVar40;
                    auVar65 = psubsw(auVar65,auVar13);
                    sVar38 = auVar112._0_2_;
                    sVar82 = auVar65._0_2_;
                    auVar44._0_2_ = -(ushort)(sVar82 < sVar38);
                    sVar49 = auVar112._2_2_;
                    sVar84 = auVar65._2_2_;
                    auVar44._2_2_ = -(ushort)(sVar84 < sVar49);
                    sVar50 = auVar112._4_2_;
                    sVar85 = auVar65._4_2_;
                    auVar44._4_2_ = -(ushort)(sVar85 < sVar50);
                    sVar51 = auVar112._6_2_;
                    sVar86 = auVar65._6_2_;
                    auVar44._6_2_ = -(ushort)(sVar86 < sVar51);
                    sVar52 = auVar112._8_2_;
                    sVar87 = auVar65._8_2_;
                    auVar44._8_2_ = -(ushort)(sVar87 < sVar52);
                    sVar53 = auVar112._10_2_;
                    sVar88 = auVar65._10_2_;
                    auVar44._10_2_ = -(ushort)(sVar88 < sVar53);
                    sVar54 = auVar112._12_2_;
                    sVar89 = auVar65._12_2_;
                    sVar55 = auVar112._14_2_;
                    auVar44._12_2_ = -(ushort)(sVar89 < sVar54);
                    sVar90 = auVar65._14_2_;
                    auVar44._14_2_ = -(ushort)(sVar90 < sVar55);
                    auVar65 = pblendvb(auVar43,auVar107,auVar44);
                    auVar112 = pblendvb(auVar104,auVar91,auVar44);
                    auVar43 = paddsw(auVar67,auVar56);
                    auVar56 = paddsw(auVar113,auVar56);
                    auVar104 = pblendvb(auVar43,auVar56,auVar44);
                    auVar43 = psubsw(auVar96,auVar13);
                    sVar94 = auVar43._0_2_;
                    auVar67._0_2_ = -(ushort)(sVar94 < sVar38);
                    sVar97 = auVar43._2_2_;
                    auVar67._2_2_ = -(ushort)(sVar97 < sVar49);
                    sVar98 = auVar43._4_2_;
                    auVar67._4_2_ = -(ushort)(sVar98 < sVar50);
                    sVar99 = auVar43._6_2_;
                    auVar67._6_2_ = -(ushort)(sVar99 < sVar51);
                    sVar100 = auVar43._8_2_;
                    auVar67._8_2_ = -(ushort)(sVar100 < sVar52);
                    sVar101 = auVar43._10_2_;
                    auVar67._10_2_ = -(ushort)(sVar101 < sVar53);
                    sVar102 = auVar43._12_2_;
                    auVar67._12_2_ = -(ushort)(sVar102 < sVar54);
                    sVar103 = auVar43._14_2_;
                    auVar67._14_2_ = -(ushort)(sVar103 < sVar55);
                    local_1c8 = pblendvb(local_1c8,auVar107,auVar67);
                    sVar80 = auVar107._0_2_;
                    uVar76 = (ushort)((short)uVar76 < sVar80) * sVar80 |
                             ((short)uVar76 >= sVar80) * uVar76;
                    sVar80 = auVar107._2_2_;
                    uVar108 = (ushort)((short)uVar108 < sVar80) * sVar80 |
                              ((short)uVar108 >= sVar80) * uVar108;
                    sVar80 = auVar107._4_2_;
                    uVar77 = (ushort)((short)uVar77 < sVar80) * sVar80 |
                             ((short)uVar77 >= sVar80) * uVar77;
                    sVar80 = auVar107._6_2_;
                    uVar109 = (ushort)((short)uVar109 < sVar80) * sVar80 |
                              ((short)uVar109 >= sVar80) * uVar109;
                    sVar80 = auVar107._8_2_;
                    uVar78 = (ushort)((short)uVar78 < sVar80) * sVar80 |
                             ((short)uVar78 >= sVar80) * uVar78;
                    sVar80 = auVar107._10_2_;
                    uVar110 = (ushort)((short)uVar110 < sVar80) * sVar80 |
                              ((short)uVar110 >= sVar80) * uVar110;
                    sVar80 = auVar107._12_2_;
                    uVar79 = (ushort)((short)uVar79 < sVar80) * sVar80 |
                             ((short)uVar79 >= sVar80) * uVar79;
                    sVar80 = auVar107._14_2_;
                    uVar111 = (ushort)((short)uVar111 < sVar80) * sVar80 |
                              ((short)uVar111 >= sVar80) * uVar111;
                    local_178._2_2_ =
                         ((short)uVar108 < (short)uVar61) * uVar61 |
                         ((short)uVar108 >= (short)uVar61) * uVar108;
                    local_178._0_2_ =
                         ((short)uVar76 < (short)uVar70) * uVar70 |
                         ((short)uVar76 >= (short)uVar70) * uVar76;
                    local_178._4_2_ =
                         ((short)uVar77 < (short)uVar73) * uVar73 |
                         ((short)uVar77 >= (short)uVar73) * uVar77;
                    local_178._6_2_ =
                         ((short)uVar109 < (short)uVar62) * uVar62 |
                         ((short)uVar109 >= (short)uVar62) * uVar109;
                    local_178._8_2_ =
                         ((short)uVar78 < (short)uVar63) * uVar63 |
                         ((short)uVar78 >= (short)uVar63) * uVar78;
                    local_178._10_2_ =
                         ((short)uVar110 < (short)uVar74) * uVar74 |
                         ((short)uVar110 >= (short)uVar74) * uVar110;
                    local_178._12_2_ =
                         ((short)uVar79 < (short)uVar75) * uVar75 |
                         ((short)uVar79 >= (short)uVar75) * uVar79;
                    local_178._14_2_ =
                         ((short)uVar111 < (short)uVar64) * uVar64 |
                         ((short)uVar111 >= (short)uVar64) * uVar111;
                    puVar1 = (ushort *)((long)*ptr + lVar37);
                    *puVar1 = (ushort)(sVar38 < sVar82) * sVar82 |
                              (ushort)(sVar38 >= sVar82) * sVar38;
                    puVar1[1] = (ushort)(sVar49 < sVar84) * sVar84 |
                                (ushort)(sVar49 >= sVar84) * sVar49;
                    puVar1[2] = (ushort)(sVar50 < sVar85) * sVar85 |
                                (ushort)(sVar50 >= sVar85) * sVar50;
                    puVar1[3] = (ushort)(sVar51 < sVar86) * sVar86 |
                                (ushort)(sVar51 >= sVar86) * sVar51;
                    puVar1[4] = (ushort)(sVar52 < sVar87) * sVar87 |
                                (ushort)(sVar52 >= sVar87) * sVar52;
                    puVar1[5] = (ushort)(sVar53 < sVar88) * sVar88 |
                                (ushort)(sVar53 >= sVar88) * sVar53;
                    puVar1[6] = (ushort)(sVar54 < sVar89) * sVar89 |
                                (ushort)(sVar54 >= sVar89) * sVar54;
                    puVar1[7] = (ushort)(sVar55 < sVar90) * sVar90 |
                                (ushort)(sVar55 >= sVar90) * sVar55;
                    local_118 = auVar65._0_8_;
                    uStack_110 = auVar65._8_8_;
                    puVar2 = (undefined8 *)((long)*b_01 + lVar37);
                    *puVar2 = local_118;
                    puVar2[1] = uStack_110;
                    *(undefined1 (*) [16])((long)*b_02 + lVar37) = auVar112;
                    *(undefined1 (*) [16])((long)*b_03 + lVar37) = auVar104;
                    auVar96._0_2_ =
                         (ushort)(sVar38 < sVar94) * sVar94 | (ushort)(sVar38 >= sVar94) * sVar38;
                    auVar96._2_2_ =
                         (ushort)(sVar49 < sVar97) * sVar97 | (ushort)(sVar49 >= sVar97) * sVar49;
                    auVar96._4_2_ =
                         (ushort)(sVar50 < sVar98) * sVar98 | (ushort)(sVar50 >= sVar98) * sVar50;
                    auVar96._6_2_ =
                         (ushort)(sVar51 < sVar99) * sVar99 | (ushort)(sVar51 >= sVar99) * sVar51;
                    auVar96._8_2_ =
                         (ushort)(sVar52 < sVar100) * sVar100 | (ushort)(sVar52 >= sVar100) * sVar52
                    ;
                    auVar96._10_2_ =
                         (ushort)(sVar53 < sVar101) * sVar101 | (ushort)(sVar53 >= sVar101) * sVar53
                    ;
                    auVar96._12_2_ =
                         (ushort)(sVar54 < sVar102) * sVar102 | (ushort)(sVar54 >= sVar102) * sVar54
                    ;
                    auVar96._14_2_ =
                         (ushort)(sVar55 < sVar103) * sVar103 | (ushort)(sVar55 >= sVar103) * sVar55
                    ;
                    local_168 = pblendvb(local_168,auVar91,auVar67);
                    auVar65 = paddsw(in_XMM11,_DAT_008a1ba0);
                    in_XMM11 = pblendvb(auVar65,auVar56,auVar67);
                    auVar56 = *(undefined1 (*) [16])((long)*local_210 + lVar37);
                    auVar112 = *(undefined1 (*) [16])((long)*b + lVar37);
                    auVar91 = *(undefined1 (*) [16])((long)*b_00 + lVar37);
                    auVar113 = *(undefined1 (*) [16])((long)*local_200 + lVar37);
                  }
                  local_88 = auVar83._0_2_;
                  sStack_86 = auVar83._2_2_;
                  sStack_84 = auVar83._4_2_;
                  sStack_82 = auVar83._6_2_;
                  sStack_80 = auVar83._8_2_;
                  sStack_7e = auVar83._10_2_;
                  sStack_7c = auVar83._12_2_;
                  sStack_7a = auVar83._14_2_;
                  for (iVar33 = 0; iVar33 != 8; iVar33 = iVar33 + 1) {
                    uVar30 = uVar31;
                    if (s2_beg == 0) {
                      uVar30 = ptr_00[uVar32 + 1] - open;
                    }
                    uVar95 = local_210[uVar23][0];
                    if ((int)uVar30 < -0x7fff) {
                      uVar30 = 0xffff8000;
                    }
                    lVar37 = local_1c8._8_8_;
                    uVar105 = local_1c8._0_8_;
                    local_1c8._0_8_ = uVar105 << 0x10;
                    local_1c8._8_8_ = lVar37 << 0x10 | uVar105 >> 0x30;
                    auVar107._8_8_ = local_210[uVar23][1] << 0x10 | uVar95 >> 0x30;
                    auVar107._0_8_ = uVar95 << 0x10 | (ulong)(ushort)ptr_00[uVar32];
                    lVar37 = local_168._8_8_;
                    uVar95 = local_168._0_8_;
                    local_168._0_8_ = uVar95 << 0x10;
                    local_168._8_8_ = lVar37 << 0x10 | uVar95 >> 0x30;
                    uVar95 = auVar96._0_8_;
                    auVar96._8_8_ = auVar96._8_8_ << 0x10 | uVar95 >> 0x30;
                    auVar96._0_8_ = uVar95 << 0x10 | (ulong)uVar30 & 0xffff;
                    uVar95 = in_XMM11._0_8_;
                    in_XMM11._8_8_ = in_XMM11._8_8_ << 0x10 | uVar95 >> 0x30;
                    in_XMM11._0_8_ = uVar95 << 0x10 | 1;
                    for (lVar37 = 0; uVar36 << 4 != lVar37; lVar37 = lVar37 + 0x10) {
                      auVar65 = paddsw(auVar107,*(undefined1 (*) [16])
                                                 ((long)pvVar5 + lVar37 + lVar26));
                      psVar3 = (short *)((long)*ptr_01 + lVar37);
                      sVar55 = *psVar3;
                      sVar82 = psVar3[1];
                      sVar84 = psVar3[2];
                      sVar85 = psVar3[3];
                      sVar86 = psVar3[4];
                      sVar87 = psVar3[5];
                      sVar88 = psVar3[6];
                      sVar89 = psVar3[7];
                      sVar80 = auVar96._0_2_;
                      auVar58._0_2_ =
                           (ushort)(sVar55 < sVar80) * sVar80 | (ushort)(sVar55 >= sVar80) * sVar55;
                      sVar38 = auVar96._2_2_;
                      auVar58._2_2_ =
                           (ushort)(sVar82 < sVar38) * sVar38 | (ushort)(sVar82 >= sVar38) * sVar82;
                      sVar49 = auVar96._4_2_;
                      auVar58._4_2_ =
                           (ushort)(sVar84 < sVar49) * sVar49 | (ushort)(sVar84 >= sVar49) * sVar84;
                      sVar50 = auVar96._6_2_;
                      auVar58._6_2_ =
                           (ushort)(sVar85 < sVar50) * sVar50 | (ushort)(sVar85 >= sVar50) * sVar85;
                      sVar51 = auVar96._8_2_;
                      auVar58._8_2_ =
                           (ushort)(sVar86 < sVar51) * sVar51 | (ushort)(sVar86 >= sVar51) * sVar86;
                      sVar52 = auVar96._10_2_;
                      auVar58._10_2_ =
                           (ushort)(sVar87 < sVar52) * sVar52 | (ushort)(sVar87 >= sVar52) * sVar87;
                      sVar53 = auVar96._12_2_;
                      auVar58._12_2_ =
                           (ushort)(sVar88 < sVar53) * sVar53 | (ushort)(sVar88 >= sVar53) * sVar88;
                      sVar54 = auVar96._14_2_;
                      auVar58._14_2_ =
                           (ushort)(sVar89 < sVar54) * sVar54 | (ushort)(sVar89 >= sVar54) * sVar89;
                      *(undefined1 (*) [16])((long)*ptr_01 + lVar37) = auVar58;
                      auVar68._0_2_ = -(ushort)(auVar65._0_2_ == auVar58._0_2_);
                      auVar68._2_2_ = -(ushort)(auVar65._2_2_ == auVar58._2_2_);
                      auVar68._4_2_ = -(ushort)(auVar65._4_2_ == auVar58._4_2_);
                      auVar68._6_2_ = -(ushort)(auVar65._6_2_ == auVar58._6_2_);
                      auVar68._8_2_ = -(ushort)(auVar65._8_2_ == auVar58._8_2_);
                      auVar68._10_2_ = -(ushort)(auVar65._10_2_ == auVar58._10_2_);
                      auVar68._12_2_ = -(ushort)(auVar65._12_2_ == auVar58._12_2_);
                      auVar68._14_2_ = -(ushort)(auVar65._14_2_ == auVar58._14_2_);
                      auVar45._0_2_ = -(ushort)(sVar80 < sVar55);
                      auVar45._2_2_ = -(ushort)(sVar38 < sVar82);
                      auVar45._4_2_ = -(ushort)(sVar49 < sVar84);
                      auVar45._6_2_ = -(ushort)(sVar50 < sVar85);
                      auVar45._8_2_ = -(ushort)(sVar51 < sVar86);
                      auVar45._10_2_ = -(ushort)(sVar52 < sVar87);
                      auVar45._12_2_ = -(ushort)(sVar53 < sVar88);
                      auVar45._14_2_ = -(ushort)(sVar54 < sVar89);
                      auVar45 = auVar45 | auVar68;
                      auVar43 = pblendvb(local_1c8,*(undefined1 (*) [16])((long)*ptr_02 + lVar37),
                                         auVar45);
                      *(undefined1 (*) [16])((long)*ptr_02 + lVar37) = auVar43;
                      auVar83 = pblendvb(local_168,*(undefined1 (*) [16])((long)*palVar21 + lVar37),
                                         auVar45);
                      *(undefined1 (*) [16])((long)*palVar21 + lVar37) = auVar83;
                      auVar104 = pblendvb(in_XMM11,*(undefined1 (*) [16])((long)*ptr_03 + lVar37),
                                          auVar45);
                      *(undefined1 (*) [16])((long)*ptr_03 + lVar37) = auVar104;
                      local_1a8._0_4_ =
                           CONCAT22(((short)auVar58._2_2_ < local_1a8._2_2_) * auVar58._2_2_ |
                                    (ushort)((short)auVar58._2_2_ >= local_1a8._2_2_) *
                                    local_1a8._2_2_,
                                    ((short)auVar58._0_2_ < (short)local_1a8) * auVar58._0_2_ |
                                    (ushort)((short)auVar58._0_2_ >= (short)local_1a8) *
                                    (short)local_1a8);
                      local_1a8._0_6_ =
                           CONCAT24(((short)auVar58._4_2_ < local_1a8._4_2_) * auVar58._4_2_ |
                                    (ushort)((short)auVar58._4_2_ >= local_1a8._4_2_) *
                                    local_1a8._4_2_,(undefined4)local_1a8);
                      local_1a8 = CONCAT26(((short)auVar58._6_2_ < local_1a8._6_2_) * auVar58._6_2_
                                           | (ushort)((short)auVar58._6_2_ >= local_1a8._6_2_) *
                                             local_1a8._6_2_,(undefined6)local_1a8);
                      uStack_1a0._0_4_ =
                           CONCAT22(((short)auVar58._10_2_ < uStack_1a0._2_2_) * auVar58._10_2_ |
                                    (ushort)((short)auVar58._10_2_ >= uStack_1a0._2_2_) *
                                    uStack_1a0._2_2_,
                                    ((short)auVar58._8_2_ < (short)uStack_1a0) * auVar58._8_2_ |
                                    (ushort)((short)auVar58._8_2_ >= (short)uStack_1a0) *
                                    (short)uStack_1a0);
                      uStack_1a0._0_6_ =
                           CONCAT24(((short)auVar58._12_2_ < uStack_1a0._4_2_) * auVar58._12_2_ |
                                    (ushort)((short)auVar58._12_2_ >= uStack_1a0._4_2_) *
                                    uStack_1a0._4_2_,(undefined4)uStack_1a0);
                      uStack_1a0 = CONCAT26(((short)auVar58._14_2_ < uStack_1a0._6_2_) *
                                            auVar58._14_2_ |
                                            (ushort)((short)auVar58._14_2_ >= uStack_1a0._6_2_) *
                                            uStack_1a0._6_2_,(undefined6)uStack_1a0);
                      sVar80 = local_178._0_2_;
                      uVar70 = (sVar80 < (short)auVar58._0_2_) * auVar58._0_2_ |
                               (ushort)(sVar80 >= (short)auVar58._0_2_) * sVar80;
                      sVar80 = local_178._2_2_;
                      uVar61 = (sVar80 < (short)auVar58._2_2_) * auVar58._2_2_ |
                               (ushort)(sVar80 >= (short)auVar58._2_2_) * sVar80;
                      sVar80 = local_178._4_2_;
                      uVar73 = (sVar80 < (short)auVar58._4_2_) * auVar58._4_2_ |
                               (ushort)(sVar80 >= (short)auVar58._4_2_) * sVar80;
                      sVar80 = local_178._6_2_;
                      uVar62 = (sVar80 < (short)auVar58._6_2_) * auVar58._6_2_ |
                               (ushort)(sVar80 >= (short)auVar58._6_2_) * sVar80;
                      sVar80 = local_178._8_2_;
                      uVar63 = (sVar80 < (short)auVar58._8_2_) * auVar58._8_2_ |
                               (ushort)(sVar80 >= (short)auVar58._8_2_) * sVar80;
                      sVar80 = local_178._10_2_;
                      uVar74 = (sVar80 < (short)auVar58._10_2_) * auVar58._10_2_ |
                               (ushort)(sVar80 >= (short)auVar58._10_2_) * sVar80;
                      sVar80 = local_178._12_2_;
                      sVar38 = local_178._14_2_;
                      uVar75 = (sVar80 < (short)auVar58._12_2_) * auVar58._12_2_ |
                               (ushort)(sVar80 >= (short)auVar58._12_2_) * sVar80;
                      uVar64 = (sVar38 < (short)auVar58._14_2_) * auVar58._14_2_ |
                               (ushort)(sVar38 >= (short)auVar58._14_2_) * sVar38;
                      sVar80 = auVar43._0_2_;
                      uVar70 = (ushort)((short)uVar70 < sVar80) * sVar80 |
                               ((short)uVar70 >= sVar80) * uVar70;
                      sVar80 = auVar43._2_2_;
                      uVar61 = (ushort)((short)uVar61 < sVar80) * sVar80 |
                               ((short)uVar61 >= sVar80) * uVar61;
                      sVar80 = auVar43._4_2_;
                      uVar73 = (ushort)((short)uVar73 < sVar80) * sVar80 |
                               ((short)uVar73 >= sVar80) * uVar73;
                      sVar80 = auVar43._6_2_;
                      uVar62 = (ushort)((short)uVar62 < sVar80) * sVar80 |
                               ((short)uVar62 >= sVar80) * uVar62;
                      sVar80 = auVar43._8_2_;
                      uVar63 = (ushort)((short)uVar63 < sVar80) * sVar80 |
                               ((short)uVar63 >= sVar80) * uVar63;
                      sVar80 = auVar43._10_2_;
                      uVar74 = (ushort)((short)uVar74 < sVar80) * sVar80 |
                               ((short)uVar74 >= sVar80) * uVar74;
                      sVar80 = auVar43._12_2_;
                      uVar75 = (ushort)((short)uVar75 < sVar80) * sVar80 |
                               ((short)uVar75 >= sVar80) * uVar75;
                      sVar80 = auVar43._14_2_;
                      uVar64 = (ushort)((short)uVar64 < sVar80) * sVar80 |
                               ((short)uVar64 >= sVar80) * uVar64;
                      sVar80 = auVar104._0_2_;
                      sVar38 = auVar83._0_2_;
                      uVar76 = (ushort)(sVar38 < sVar80) * sVar80 |
                               (ushort)(sVar38 >= sVar80) * sVar38;
                      sVar80 = auVar104._2_2_;
                      sVar38 = auVar83._2_2_;
                      uVar108 = (ushort)(sVar38 < sVar80) * sVar80 |
                                (ushort)(sVar38 >= sVar80) * sVar38;
                      sVar80 = auVar104._4_2_;
                      sVar38 = auVar83._4_2_;
                      uVar77 = (ushort)(sVar38 < sVar80) * sVar80 |
                               (ushort)(sVar38 >= sVar80) * sVar38;
                      sVar80 = auVar104._6_2_;
                      sVar38 = auVar83._6_2_;
                      uVar109 = (ushort)(sVar38 < sVar80) * sVar80 |
                                (ushort)(sVar38 >= sVar80) * sVar38;
                      sVar80 = auVar104._8_2_;
                      sVar38 = auVar83._8_2_;
                      uVar78 = (ushort)(sVar38 < sVar80) * sVar80 |
                               (ushort)(sVar38 >= sVar80) * sVar38;
                      sVar80 = auVar104._10_2_;
                      sVar38 = auVar83._10_2_;
                      uVar110 = (ushort)(sVar38 < sVar80) * sVar80 |
                                (ushort)(sVar38 >= sVar80) * sVar38;
                      sVar80 = auVar104._12_2_;
                      sVar38 = auVar83._12_2_;
                      sVar49 = auVar83._14_2_;
                      uVar79 = (ushort)(sVar38 < sVar80) * sVar80 |
                               (ushort)(sVar38 >= sVar80) * sVar38;
                      sVar80 = auVar104._14_2_;
                      uVar111 = (ushort)(sVar49 < sVar80) * sVar80 |
                                (ushort)(sVar49 >= sVar80) * sVar49;
                      local_178._0_2_ =
                           ((short)uVar76 < (short)uVar70) * uVar70 |
                           ((short)uVar76 >= (short)uVar70) * uVar76;
                      local_178._2_2_ =
                           ((short)uVar108 < (short)uVar61) * uVar61 |
                           ((short)uVar108 >= (short)uVar61) * uVar108;
                      local_178._4_2_ =
                           ((short)uVar77 < (short)uVar73) * uVar73 |
                           ((short)uVar77 >= (short)uVar73) * uVar77;
                      local_178._6_2_ =
                           ((short)uVar109 < (short)uVar62) * uVar62 |
                           ((short)uVar109 >= (short)uVar62) * uVar109;
                      local_178._8_2_ =
                           ((short)uVar78 < (short)uVar63) * uVar63 |
                           ((short)uVar78 >= (short)uVar63) * uVar78;
                      local_178._10_2_ =
                           ((short)uVar110 < (short)uVar74) * uVar74 |
                           ((short)uVar110 >= (short)uVar74) * uVar110;
                      local_178._12_2_ =
                           ((short)uVar79 < (short)uVar75) * uVar75 |
                           ((short)uVar79 >= (short)uVar75) * uVar79;
                      local_178._14_2_ =
                           ((short)uVar111 < (short)uVar64) * uVar64 |
                           ((short)uVar111 >= (short)uVar64) * uVar111;
                      auVar11._4_4_ = uVar39;
                      auVar11._0_4_ = uVar39;
                      auVar11._8_4_ = uVar39;
                      auVar11._12_4_ = uVar39;
                      auVar65 = psubsw(auVar58,auVar11);
                      auVar14._4_4_ = uVar40;
                      auVar14._0_4_ = uVar40;
                      auVar14._8_4_ = uVar40;
                      auVar14._12_4_ = uVar40;
                      auVar96 = psubsw(auVar96,auVar14);
                      auVar59._0_2_ = -(ushort)(auVar96._0_2_ < auVar65._0_2_);
                      auVar59._2_2_ = -(ushort)(auVar96._2_2_ < auVar65._2_2_);
                      auVar59._4_2_ = -(ushort)(auVar96._4_2_ < auVar65._4_2_);
                      auVar59._6_2_ = -(ushort)(auVar96._6_2_ < auVar65._6_2_);
                      auVar59._8_2_ = -(ushort)(auVar96._8_2_ < auVar65._8_2_);
                      auVar59._10_2_ = -(ushort)(auVar96._10_2_ < auVar65._10_2_);
                      auVar59._12_2_ = -(ushort)(auVar96._12_2_ < auVar65._12_2_);
                      auVar59._14_2_ = -(ushort)(auVar96._14_2_ < auVar65._14_2_);
                      if ((ushort)((ushort)(SUB161(auVar59 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar59 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar59 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar59 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar59 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar59 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar59 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar59 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar59 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar59 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar59 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar59 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar59 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar59 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)((byte)(auVar59._14_2_ >> 7) & 1) << 0xe |
                                  auVar59._14_2_ & 0x8000) == 0xffff) goto LAB_0064ed13;
                      local_1c8 = pblendvb(local_1c8,auVar43,auVar59);
                      local_168 = pblendvb(local_168,auVar83,auVar59);
                      auVar65 = pmovsxbw(auVar59,0x101010101010101);
                      auVar43 = paddsw(in_XMM11,auVar65);
                      auVar65 = paddsw(auVar104,auVar65);
                      in_XMM11 = pblendvb(auVar43,auVar65,auVar59);
                      auVar107 = *(undefined1 (*) [16])((long)*local_210 + lVar37);
                    }
                  }
LAB_0064ed13:
                  palVar18 = ptr_01 + uVar41;
                  sVar80 = (short)(*palVar18)[0];
                  sVar38 = *(short *)((long)*palVar18 + 2);
                  sVar49 = *(short *)((long)*palVar18 + 4);
                  sVar50 = *(short *)((long)*palVar18 + 6);
                  sVar51 = (short)(*palVar18)[1];
                  sVar52 = *(short *)((long)*palVar18 + 10);
                  sVar53 = *(short *)((long)*palVar18 + 0xc);
                  sVar54 = *(short *)((long)*palVar18 + 0xe);
                  auVar46._0_2_ = -(ushort)(local_88 < sVar80);
                  auVar46._2_2_ = -(ushort)(sStack_86 < sVar38);
                  auVar46._4_2_ = -(ushort)(sStack_84 < sVar49);
                  auVar46._6_2_ = -(ushort)(sStack_82 < sVar50);
                  auVar46._8_2_ = -(ushort)(sStack_80 < sVar51);
                  auVar46._10_2_ = -(ushort)(sStack_7e < sVar52);
                  auVar46._12_2_ = -(ushort)(sStack_7c < sVar53);
                  auVar46._14_2_ = -(ushort)(sStack_7a < sVar54);
                  auVar93 = pblendvb(auVar93,(undefined1  [16])ptr_02[uVar41],auVar46);
                  auVar114 = pblendvb(auVar114,(undefined1  [16])palVar21[uVar41],auVar46);
                  auVar92 = pblendvb(auVar92,(undefined1  [16])ptr_03[uVar41],auVar46);
                  auVar83._0_2_ =
                       (ushort)(local_88 < sVar80) * sVar80 |
                       (ushort)(local_88 >= sVar80) * local_88;
                  auVar83._2_2_ =
                       (ushort)(sStack_86 < sVar38) * sVar38 |
                       (ushort)(sStack_86 >= sVar38) * sStack_86;
                  auVar83._4_2_ =
                       (ushort)(sStack_84 < sVar49) * sVar49 |
                       (ushort)(sStack_84 >= sVar49) * sStack_84;
                  auVar83._6_2_ =
                       (ushort)(sStack_82 < sVar50) * sVar50 |
                       (ushort)(sStack_82 >= sVar50) * sStack_82;
                  auVar83._8_2_ =
                       (ushort)(sStack_80 < sVar51) * sVar51 |
                       (ushort)(sStack_80 >= sVar51) * sStack_80;
                  auVar83._10_2_ =
                       (ushort)(sStack_7e < sVar52) * sVar52 |
                       (ushort)(sStack_7e >= sVar52) * sStack_7e;
                  auVar83._12_2_ =
                       (ushort)(sStack_7c < sVar53) * sVar53 |
                       (ushort)(sStack_7c >= sVar53) * sStack_7c;
                  auVar83._14_2_ =
                       (ushort)(sStack_7a < sVar54) * sVar54 |
                       (ushort)(sStack_7a >= sVar54) * sStack_7a;
                  auVar12._2_2_ = -(ushort)(sStack_106 == 6);
                  auVar12._0_2_ = -(ushort)(local_108 == 7);
                  auVar12._4_2_ = -(ushort)(local_108 == 5);
                  auVar12._6_2_ = -(ushort)(sStack_106 == 4);
                  auVar12._8_2_ = -(ushort)(local_108 == 3);
                  auVar12._10_2_ = -(ushort)(sStack_106 == 2);
                  auVar12._12_2_ = -(ushort)(local_108 == 1);
                  auVar12._14_2_ = -(ushort)(sStack_106 == 0);
                  auVar46 = auVar46 & auVar12;
                  if ((((((((((((((((auVar46 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar46 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar46 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar46 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar46 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar46 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar46 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar46 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar46 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar46 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar46 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar46 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar46 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar46[0xf] < '\0') {
                    local_218 = (int)uVar32;
                  }
                  uVar32 = uVar32 + 1;
                  palVar18 = local_210;
                  palVar19 = b;
                  palVar20 = b_00;
                  b_00 = palVar21;
                  palVar21 = local_200;
                  b = ptr_02;
                  local_210 = ptr_01;
                  local_200 = ptr_03;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar24 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_stats_striped_profile_sse41_128_16",pcVar24);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMStore = NULL;
    __m128i* restrict pvHMLoad = NULL;
    __m128i* restrict pvHSStore = NULL;
    __m128i* restrict pvHSLoad = NULL;
    __m128i* restrict pvHLStore = NULL;
    __m128i* restrict pvHLLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHM;
    __m128i vMaxHS;
    __m128i vMaxHL;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile  = (__m128i*)profile->profile16.score;
    vProfileM = (__m128i*)profile->profile16.matches;
    vProfileS = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHM = vNegLimit;
    vMaxHS = vNegLimit;
    vMaxHL = vNegLimit;
    vPosMask = _mm_cmpeq_epi16(_mm_set1_epi16(position),
            _mm_set_epi16(0,1,2,3,4,5,6,7));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m128i(16, segLen);
    pvHLoad   = parasail_memalign___m128i(16, segLen);
    pvHMStore = parasail_memalign___m128i(16, segLen);
    pvHMLoad  = parasail_memalign___m128i(16, segLen);
    pvHSStore = parasail_memalign___m128i(16, segLen);
    pvHSLoad  = parasail_memalign___m128i(16, segLen);
    pvHLStore = parasail_memalign___m128i(16, segLen);
    pvHLLoad  = parasail_memalign___m128i(16, segLen);
    pvE       = parasail_memalign___m128i(16, segLen);
    pvEM      = parasail_memalign___m128i(16, segLen);
    pvES      = parasail_memalign___m128i(16, segLen);
    pvEL      = parasail_memalign___m128i(16, segLen);
    boundary  = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHMStore, vZero, segLen);
    parasail_memset___m128i(pvHSStore, vZero, segLen);
    parasail_memset___m128i(pvHLStore, vZero, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vOne, segLen);

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vH_dag;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        const __m128i* vP = NULL;
        const __m128i* vPM = NULL;
        const __m128i* vPS = NULL;

        /* Initialize F value to neg inf.  Any errors to vH values will
         * be corrected in the Lazy_F loop. */
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vHM = _mm_load_si128(&pvHMStore[segLen - 1]);
        vHS = _mm_load_si128(&pvHSStore[segLen - 1]);
        vHL = _mm_load_si128(&pvHLStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 2);
        vHM = _mm_slli_si128(vHM, 2);
        vHS = _mm_slli_si128(vHS, 2);
        vHL = _mm_slli_si128(vHL, 2);

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        SWAP(pvHLoad,  pvHStore)
        SWAP(pvHMLoad, pvHMStore)
        SWAP(pvHSLoad, pvHSStore)
        SWAP(pvHLLoad, pvHLStore)

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m128i case1;
            __m128i case2;

            vE = _mm_load_si128(pvE+ i);
            vEM = _mm_load_si128(pvEM+ i);
            vES = _mm_load_si128(pvES+ i);
            vEL = _mm_load_si128(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vH = _mm_max_epi16(vH_dag, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            case1 = _mm_cmpeq_epi16(vH, vH_dag);
            case2 = _mm_cmpeq_epi16(vH, vF);

            /* calculate vM */
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_adds_epi16(vHM, _mm_load_si128(vPM + i)),
                    case1);
            _mm_store_si128(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_adds_epi16(vHS, _mm_load_si128(vPS + i)),
                    case1);
            _mm_store_si128(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_adds_epi16(vHL, vOne),
                    case1);
            _mm_store_si128(pvHLStore + i, vHL);

            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vEF_opn = _mm_subs_epi16(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vEF_opn, vE_ext);
            case1 = _mm_cmpgt_epi16(vEF_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(
                    _mm_adds_epi16(vEL, vOne),
                    _mm_adds_epi16(vHL, vOne),
                    case1);
            _mm_store_si128(pvE + i, vE);
            _mm_store_si128(pvEM + i, vEM);
            _mm_store_si128(pvES + i, vES);
            _mm_store_si128(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vEF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vEF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi16(vFL, vOne),
                    _mm_adds_epi16(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
            vHM = _mm_load_si128(pvHMLoad + i);
            vHS = _mm_load_si128(pvHSLoad + i);
            vHL = _mm_load_si128(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vHp = _mm_slli_si128(vHp, 2);
            vF = _mm_slli_si128(vF, 2);
            vFM = _mm_slli_si128(vFM, 2);
            vFS = _mm_slli_si128(vFS, 2);
            vFL = _mm_slli_si128(vFL, 2);
            vHp = _mm_insert_epi16(vHp, boundary[j], 0);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            vFL = _mm_insert_epi16(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m128i case1;
                __m128i case2;
                __m128i cond;

                vHp = _mm_adds_epi16(vHp, _mm_load_si128(vP + i));
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                case1 = _mm_cmpeq_epi16(vH, vHp);
                case2 = _mm_cmpeq_epi16(vH, vF);
                cond = _mm_andnot_si128(case1, case2);

                /* calculate vM */
                vHM = _mm_load_si128(pvHMStore + i);
                vHM = _mm_blendv_epi8(vHM, vFM, cond);
                _mm_store_si128(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm_load_si128(pvHSStore + i);
                vHS = _mm_blendv_epi8(vHS, vFS, cond);
                _mm_store_si128(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm_load_si128(pvHLStore + i);
                vHL = _mm_blendv_epi8(vHL, vFL, cond);
                _mm_store_si128(pvHLStore + i, vHL);

                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                /* Update vF value. */
                vEF_opn = _mm_subs_epi16(vH, vGapO);
                vF_ext = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi16(vF_ext, vEF_opn),
                                _mm_cmpeq_epi16(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi16(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm_cmpgt_epi16(vEF_opn, vF_ext);
                vFM = _mm_blendv_epi8(vFM, vHM, cond);
                vFS = _mm_blendv_epi8(vFS, vHS, cond);
                vFL = _mm_blendv_epi8(
                        _mm_adds_epi16(vFL, vOne),
                        _mm_adds_epi16(vHL, vOne),
                        cond);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

        /* extract vector containing last value from the column */
        {
            __m128i cond_max;
            vH = _mm_load_si128(pvHStore + offset);
            vHM = _mm_load_si128(pvHMStore + offset);
            vHS = _mm_load_si128(pvHSStore + offset);
            vHL = _mm_load_si128(pvHLStore + offset);
            cond_max = _mm_cmpgt_epi16(vH, vMaxH);
            vMaxH = _mm_blendv_epi8(vMaxH, vH, cond_max);
            vMaxHM = _mm_blendv_epi8(vMaxHM, vHM, cond_max);
            vMaxHS = _mm_blendv_epi8(vMaxHS, vHS, cond_max);
            vMaxHL = _mm_blendv_epi8(vMaxHL, vHL, cond_max);
            if (_mm_movemask_epi8(_mm_and_si128(vPosMask, cond_max))) {
                end_ref = j;
            }
        }
#ifdef PARASAIL_ROWCOL
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
            vHM = _mm_slli_si128(vHM, 2);
            vHS = _mm_slli_si128(vHS, 2);
            vHL = _mm_slli_si128(vHL, 2);
        }
        result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
        result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
        result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        __m128i vHM = _mm_load_si128(pvHMStore+i);
        __m128i vHS = _mm_load_si128(pvHSStore+i);
        __m128i vHL = _mm_load_si128(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the column maximums */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 2);
            vMaxHM = _mm_slli_si128(vMaxHM, 2);
            vMaxHS = _mm_slli_si128(vMaxHS, 2);
            vMaxHL = _mm_slli_si128(vMaxHL, 2);
        }
        end_query = s1Len-1;
        score = (int16_t) _mm_extract_epi16(vMaxH, 7);
        matches = (int16_t) _mm_extract_epi16(vMaxHM, 7);
        similar = (int16_t) _mm_extract_epi16(vMaxHS, 7);
        length = (int16_t) _mm_extract_epi16(vMaxHL, 7);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvHStore;
        int16_t *m = (int16_t*)pvHMStore;
        int16_t *s = (int16_t*)pvHSStore;
        int16_t *l = (int16_t*)pvHLStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        __m128i vHM = _mm_load_si128(pvHMStore + offset);
        __m128i vHS = _mm_load_si128(pvHSStore + offset);
        __m128i vHL = _mm_load_si128(pvHLStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
            vHM = _mm_slli_si128(vHM, 2);
            vHS = _mm_slli_si128(vHS, 2);
            vHL = _mm_slli_si128(vHL, 2);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int16_t) _mm_extract_epi16 (vH, 7);
        matches = (int16_t) _mm_extract_epi16 (vHM, 7);
        similar = (int16_t) _mm_extract_epi16 (vHS, 7);
        length = (int16_t) _mm_extract_epi16 (vHL, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}